

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function_test.cpp
# Opt level: O0

void __thiscall
reflect_function_test_DefaultConstructor_Test::TestBody
          (reflect_function_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  void *args [3];
  example_arg_type e;
  int i;
  char c;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  function_impl_example example_impl;
  function f;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  type ptr_type;
  type int_type;
  type char_type;
  AssertionResult gtest_ar;
  function_type **in_stack_fffffffffffffdd0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  AssertionResult *this_01;
  undefined1 *local_188;
  undefined4 *local_180;
  undefined8 *local_178;
  undefined8 local_16c;
  char local_164 [12];
  undefined4 local_158;
  undefined1 local_151;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_140;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined8 local_118;
  long local_110;
  AssertionResult local_108;
  void *local_f8;
  long local_f0;
  AssertHelper local_e8;
  Message local_e0;
  undefined8 local_d8;
  long local_d0;
  AssertionResult local_c8;
  AssertHelper local_b8;
  Message local_b0;
  undefined8 local_a8;
  long local_a0;
  AssertionResult local_98;
  AssertHelper local_88;
  Message local_80;
  undefined8 local_78;
  long local_70;
  AssertionResult local_68;
  long local_58;
  long local_50;
  long local_48;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar2 = log_policy_format_text();
  uVar3 = log_policy_schedule_sync();
  uVar4 = log_policy_storage_sequential();
  uVar5 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar2,uVar3,uVar4,uVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (int *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (int *)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bc95);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x7e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10bcf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd50);
  local_48 = type_create(1,"char",0);
  local_50 = type_create(3,"int",0);
  local_58 = type_create(0xb,"ptr",0);
  local_70 = local_48;
  local_78 = 0;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (type_type **)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (type_type **)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10be69);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x84,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message((Message *)0x10bec6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf1b);
  local_a0 = local_50;
  local_a8 = 0;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (type_type **)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (type_type **)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bfcd);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x85,pcVar6);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message((Message *)0x10c02a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c07f);
  local_d0 = local_58;
  local_d8 = 0;
  testing::internal::CmpHelperNE<type_type*,type_type*>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (type_type **)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (type_type **)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c131);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
               ,0x86,pcVar6);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x10c18e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c1e6);
  if (((local_48 != 0) && (local_50 != 0)) && (local_58 != 0)) {
    local_f8 = malloc(8);
    local_110 = function_create("example",3,local_f8,function_example_singleton);
    local_118 = 0;
    this_01 = &local_108;
    local_f0 = local_110;
    testing::internal::CmpHelperNE<function_type*,function_type*>
              (&this_01->success_,in_stack_fffffffffffffde0,
               (function_type **)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      in_stack_fffffffffffffde0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x10c2ff);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
                 ,0x90,in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x10c35c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c3b4);
    if (local_f0 != 0) {
      local_13c = function_increment_reference(local_f0);
      local_140 = 0;
      this_00 = &local_138;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (&this_01->success_,in_stack_fffffffffffffde0,
                 (int *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),(int *)this_00
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c478);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_function_test/source/reflect_function_test.cpp"
                   ,0x94,pcVar6);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        testing::Message::~Message((Message *)0x10c4d3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c52b);
      uVar2 = function_signature(local_f0);
      signature_set(uVar2,0,"c",local_48);
      uVar2 = function_signature(local_f0);
      signature_set(uVar2,1,"i",local_50);
      uVar2 = function_signature(local_f0);
      signature_set(uVar2,2,"p",local_58);
      local_151 = 0x6d;
      local_158 = 0x75bcd15;
      local_16c = 0x4053333300000005;
      builtin_strncpy(local_164,"ABCDEFGHI",10);
      local_164[10] = '\0';
      local_164[0xb] = '\0';
      local_188 = &local_151;
      local_180 = &local_158;
      local_178 = &local_16c;
      function_call(local_f0,&local_188,3);
      function_destroy(local_f0);
    }
    type_destroy(local_48);
    type_destroy(local_50);
    type_destroy(local_58);
  }
  return;
}

Assistant:

TEST_F(reflect_function_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	type char_type = type_create(TYPE_CHAR, "char", NULL, NULL);
	type int_type = type_create(TYPE_INT, "int", NULL, NULL);
	type ptr_type = type_create(TYPE_PTR, "ptr", NULL, NULL);

	EXPECT_NE((type)char_type, (type)NULL);
	EXPECT_NE((type)int_type, (type)NULL);
	EXPECT_NE((type)ptr_type, (type)NULL);

	if (char_type != NULL && int_type != NULL && ptr_type != NULL)
	{
		function f;

		function_impl_example example_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f = function_create("example", 3, example_impl, &function_example_singleton);

		EXPECT_NE((function)f, (function)NULL);

		if (f != NULL)
		{
			EXPECT_EQ((int)function_increment_reference(f), (int)0);

			signature_set(function_signature(f), 0, "c", char_type);
			signature_set(function_signature(f), 1, "i", int_type);
			signature_set(function_signature(f), 2, "p", ptr_type);

			/* function call example */
			{
				char c = 'm';
				int i = 123456789;
				struct example_arg_type e = { 5, 3.3f, "ABCDEFGHI" };

				function_args args = { &c, &i, &e };

				function_call(f, args, sizeof(args) / sizeof(args[0]));
			}

			function_destroy(f);
		}

		type_destroy(char_type);
		type_destroy(int_type);
		type_destroy(ptr_type);
	}
}